

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

void __thiscall QPDF::stopOnError(QPDF *this,string *message)

{
  QPDFExc *__return_storage_ptr__;
  string local_48;
  
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  damagedPDF(__return_storage_ptr__,this,&local_48,message);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::stopOnError(std::string const& message)
{
    throw damagedPDF("", message);
}